

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uchar * __thiscall
cimg_library::CImg<unsigned_char>::_atXYZC(CImg<unsigned_char> *this,int x,int y,int z,int c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar7 = (ulong)(uVar1 - 1);
  if (x < (int)uVar1) {
    uVar7 = (ulong)(uint)x;
  }
  if (x < 0) {
    uVar7 = 0;
  }
  uVar4 = (ulong)(uVar2 - 1);
  if (y < (int)uVar2) {
    uVar4 = (ulong)(uint)y;
  }
  if (y < 0) {
    uVar4 = 0;
  }
  uVar3 = this->_depth;
  uVar5 = (ulong)(uVar3 - 1);
  if (z < (int)uVar3) {
    uVar5 = (ulong)(uint)z;
  }
  if (z < 0) {
    uVar5 = 0;
  }
  uVar8 = (ulong)(this->_spectrum - 1);
  if (c < (int)this->_spectrum) {
    uVar8 = (ulong)(uint)c;
  }
  if (c < 0) {
    uVar8 = 0;
  }
  lVar6 = (ulong)uVar2 * (ulong)uVar1;
  return this->_data + lVar6 * (ulong)uVar3 * uVar8 + uVar5 * lVar6 + uVar7 + uVar4 * uVar1;
}

Assistant:

const T& _atXYZC(const int x, const int y, const int z, const int c) const {
      return (*this)(x<0?0:(x>=width()?width() - 1:x), y<0?0:(y>=height()?height() - 1:y),
                     z<0?0:(z>=depth()?depth() - 1:z), c<0?0:(c>=spectrum()?spectrum() - 1:c));
    }